

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O0

Vec_Int_t * Acec_InsertTree(Gia_Man_t *pNew,Vec_Wec_t *vLeafMap)

{
  int iVar1;
  Vec_Int_t *p;
  int local_40;
  int local_3c;
  int Out [2];
  int In [3];
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRootRanks;
  Vec_Wec_t *vLeafMap_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Vec_WecSize(vLeafMap);
  p = Vec_IntAlloc(iVar1 + 5);
  In[1] = 0;
  do {
    iVar1 = Vec_WecSize(vLeafMap);
    if (iVar1 <= In[1]) {
      return p;
    }
    register0x00000000 = Vec_WecEntry(vLeafMap,In[1]);
    iVar1 = Vec_IntSize(register0x00000000);
    if (iVar1 == 0) {
      Vec_IntPush(p,0);
    }
    else {
      while (iVar1 = Vec_IntSize(stack0xffffffffffffffd8), 1 < iVar1) {
        iVar1 = Vec_IntSize(stack0xffffffffffffffd8);
        if (iVar1 == 2) {
          Vec_IntPush(stack0xffffffffffffffd8,0);
        }
        Out[0] = Vec_IntEntry(stack0xffffffffffffffd8,0);
        Vec_IntDrop(stack0xffffffffffffffd8,0);
        Out[1] = Vec_IntEntry(stack0xffffffffffffffd8,0);
        Vec_IntDrop(stack0xffffffffffffffd8,0);
        Vec_IntEntry(stack0xffffffffffffffd8,0);
        Vec_IntDrop(stack0xffffffffffffffd8,0);
        Acec_InsertFadd(pNew,Out,&local_40);
        Vec_IntPush(stack0xffffffffffffffd8,local_40);
        iVar1 = Vec_WecSize(vLeafMap);
        if (In[1] + 1 < iVar1) {
          register0x00000000 = Vec_WecEntry(vLeafMap,In[1] + 1);
        }
        else {
          register0x00000000 = Vec_WecPushLevel(vLeafMap);
        }
        Vec_IntPush(stack0xffffffffffffffd8,local_3c);
        register0x00000000 = Vec_WecEntry(vLeafMap,In[1]);
      }
      iVar1 = Vec_IntSize(stack0xffffffffffffffd8);
      if (iVar1 != 1) {
        __assert_fail("Vec_IntSize(vLevel) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                      ,0x65,"Vec_Int_t *Acec_InsertTree(Gia_Man_t *, Vec_Wec_t *)");
      }
      iVar1 = Vec_IntEntry(stack0xffffffffffffffd8,0);
      Vec_IntPush(p,iVar1);
    }
    In[1] = In[1] + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acec_InsertTree( Gia_Man_t * pNew, Vec_Wec_t * vLeafMap )
{
    Vec_Int_t * vRootRanks = Vec_IntAlloc( Vec_WecSize(vLeafMap) + 5 );
    Vec_Int_t * vLevel;
    int i, In[3], Out[2];
    Vec_WecForEachLevel( vLeafMap, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) == 0 )
        {
            Vec_IntPush( vRootRanks, 0 );
            continue;
        }
        while ( Vec_IntSize(vLevel) > 1 )
        {
            if ( Vec_IntSize(vLevel) == 2 )
                Vec_IntPush( vLevel, 0 );
            //In[2] = Vec_IntPop( vLevel );
            //In[1] = Vec_IntPop( vLevel );
            //In[0] = Vec_IntPop( vLevel );

            In[0] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[1] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            In[2] = Vec_IntEntry( vLevel, 0 );
            Vec_IntDrop( vLevel, 0 );

            Acec_InsertFadd( pNew, In, Out );
            Vec_IntPush( vLevel, Out[0] );
            if ( i+1 < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i+1);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, Out[1] );
            vLevel = Vec_WecEntry(vLeafMap, i);
        }
        assert( Vec_IntSize(vLevel) == 1 );
        Vec_IntPush( vRootRanks, Vec_IntEntry(vLevel, 0) );
    }
    return vRootRanks;
}